

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O2

StressTestConfig_WriterTiming * __thiscall
perfetto::protos::gen::StressTestConfig_WriterTiming::operator=
          (StressTestConfig_WriterTiming *this,StressTestConfig_WriterTiming *param_1)

{
  double dVar1;
  double dVar2;
  double dVar3;
  
  this->payload_write_time_ms_ = param_1->payload_write_time_ms_;
  dVar1 = param_1->payload_mean_;
  dVar2 = param_1->payload_stddev_;
  dVar3 = param_1->rate_stddev_;
  this->rate_mean_ = param_1->rate_mean_;
  this->rate_stddev_ = dVar3;
  this->payload_mean_ = dVar1;
  this->payload_stddev_ = dVar2;
  ::std::__cxx11::string::operator=
            ((string *)&this->unknown_fields_,(string *)&param_1->unknown_fields_);
  (this->_has_field_).super__Base_bitset<1UL>._M_w =
       (param_1->_has_field_).super__Base_bitset<1UL>._M_w;
  return this;
}

Assistant:

bool StressTestConfig_WriterTiming::operator==(const StressTestConfig_WriterTiming& other) const {
  return unknown_fields_ == other.unknown_fields_
   && payload_mean_ == other.payload_mean_
   && payload_stddev_ == other.payload_stddev_
   && rate_mean_ == other.rate_mean_
   && rate_stddev_ == other.rate_stddev_
   && payload_write_time_ms_ == other.payload_write_time_ms_;
}